

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O1

char * spvGeneratorStr(uint32_t generator)

{
  uint32_t *puVar1;
  ulong uVar2;
  
  uVar2 = 0xc;
  puVar1 = &DAT_00405c30;
  do {
    if (puVar1[-0x10] == generator) {
      puVar1 = puVar1 + -0x10;
      goto LAB_0029acf9;
    }
    if (puVar1[-8] == generator) {
      puVar1 = puVar1 + -8;
      goto LAB_0029acf9;
    }
    if (*puVar1 == generator) goto LAB_0029acf9;
    if (puVar1[8] == generator) {
      puVar1 = puVar1 + 8;
      goto LAB_0029acf9;
    }
    uVar2 = uVar2 - 1;
    puVar1 = puVar1 + 0x20;
  } while (1 < uVar2);
  puVar1 = (uint32_t *)(&UNK_00406170 + (ulong)(generator != 0x2c) * 0x20);
LAB_0029acf9:
  if (puVar1 != (uint32_t *)(anonymous_namespace)::kOpcodeTable) {
    return *(char **)(puVar1 + 6);
  }
  return "Unknown";
}

Assistant:

const char* spvGeneratorStr(uint32_t generator) {
  auto where = std::find_if(
      std::begin(vendor_tools), std::end(vendor_tools),
      [generator](const VendorTool& vt) { return generator == vt.value; });
  if (where != std::end(vendor_tools)) return where->vendor_tool;
  return "Unknown";
}